

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# condexe.cc
# Opt level: O0

Varnode * __thiscall
ConditionalExecution::getNewMulti(ConditionalExecution *this,PcodeOp *op,BlockBasic *bl)

{
  Funcdata *pFVar1;
  int4 iVar2;
  Varnode *this_00;
  Varnode *pVVar3;
  int local_4c;
  int4 i;
  Varnode *newoutvn;
  Varnode *outvn;
  PcodeOp *local_28;
  PcodeOp *newop;
  BlockBasic *bl_local;
  PcodeOp *op_local;
  ConditionalExecution *this_local;
  
  pFVar1 = this->fd;
  newop = (PcodeOp *)bl;
  bl_local = (BlockBasic *)op;
  op_local = (PcodeOp *)this;
  iVar2 = FlowBlock::sizeIn(&bl->super_FlowBlock);
  (**(code **)&newop->opcode->opcode)(&outvn);
  local_28 = Funcdata::newOp(pFVar1,iVar2,(Address *)&outvn);
  this_00 = PcodeOp::getOut((PcodeOp *)bl_local);
  pFVar1 = this->fd;
  iVar2 = Varnode::getSize(this_00);
  pVVar3 = Funcdata::newUniqueOut(pFVar1,iVar2,local_28);
  Funcdata::opSetOpcode(this->fd,local_28,CPUI_MULTIEQUAL);
  local_4c = 0;
  while( true ) {
    iVar2 = FlowBlock::sizeIn((FlowBlock *)newop);
    if (iVar2 <= local_4c) break;
    Funcdata::opSetInput(this->fd,local_28,this_00,local_4c);
    local_4c = local_4c + 1;
  }
  Funcdata::opInsertBegin(this->fd,local_28,(BlockBasic *)newop);
  return pVVar3;
}

Assistant:

Varnode *ConditionalExecution::getNewMulti(PcodeOp *op,BlockBasic *bl)

{
  PcodeOp *newop = fd->newOp(bl->sizeIn(),bl->getStart());
  Varnode *outvn = op->getOut();
  Varnode *newoutvn;
  // Using the original outvn address may cause merge conflicts
  //  newoutvn = fd->newVarnodeOut(outvn->getSize(),outvn->getAddr(),newop);
  newoutvn = fd->newUniqueOut(outvn->getSize(),newop);
  fd->opSetOpcode(newop,CPUI_MULTIEQUAL);

  // We create NEW references to outvn, these refs will get put
  // at the end of the dependency list and will get handled in
  // due course
  for(int4 i=0;i<bl->sizeIn();++i)
    fd->opSetInput(newop,outvn,i);

  fd->opInsertBegin(newop,bl);
  return newoutvn;
}